

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmConstant *
GetConstantArrayValue
          (ExpressionContext *ctx,SynBase *source,TypeArray *typeArray,VmInstruction *instInit)

{
  VmValueType VVar1;
  uint uVar2;
  ulong uVar3;
  TypeArray *pTVar4;
  ulong uVar5;
  VmValue *__src;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  VmValue **ppVVar8;
  VmConstant *pVVar9;
  VmInstruction *instInit_00;
  TypeArray *typeArray_00;
  VmInstruction *pVVar10;
  ulong uVar11;
  char *value;
  
  if (typeArray == (TypeArray *)0x0) {
    __assert_fail("typeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xc62,
                  "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                 );
  }
  uVar3 = (typeArray->super_TypeBase).size;
  pTVar4 = (TypeArray *)typeArray->subType;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])();
  value = (char *)CONCAT44(extraout_var,iVar7);
  memset(value,0,uVar3 & 0xffffffff);
  if ((instInit->arguments).count != 0) {
    uVar11 = 0;
    do {
      pVVar10 = (VmInstruction *)(instInit->arguments).data[uVar11];
      if ((pVVar10 == (VmInstruction *)0x0) ||
         (instInit_00 = pVVar10, (pVVar10->super_VmValue).typeID != 2)) {
        instInit_00 = (VmInstruction *)0x0;
      }
      bVar6 = true;
      if (instInit_00 != (VmInstruction *)0x0) {
        if (instInit_00->cmd == VM_INST_ARRAY) {
          if ((pTVar4 == (TypeArray *)0x0) ||
             (typeArray_00 = pTVar4, (pTVar4->super_TypeBase).typeID != 0x13)) {
            typeArray_00 = (TypeArray *)0x0;
          }
          pVVar9 = GetConstantArrayValue(ctx,(SynBase *)0x0,typeArray_00,instInit_00);
          uVar5 = (pTVar4->super_TypeBase).size;
          if (uVar5 != (pVVar9->super_VmValue).type.size) {
            __assert_fail("elementType->size == elemConst->type.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0xc79,
                          "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                         );
          }
          memcpy(value + uVar5 * uVar11,pVVar9->sValue,uVar5 & 0xffffffff);
          bVar6 = false;
        }
        else if (instInit_00->cmd == VM_INST_DOUBLE_TO_FLOAT) {
          if ((instInit_00->arguments).count == 0) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          pVVar10 = (VmInstruction *)*(instInit_00->arguments).data;
        }
      }
      if (bVar6) {
        VVar1 = (pVVar10->super_VmValue).type.type;
        if (VVar1 == VM_TYPE_DOUBLE) {
          if (pTVar4 != (TypeArray *)ctx->typeDouble) goto LAB_001b0f30;
          ppVVar8 = (pVVar10->arguments).data;
LAB_001b0fab:
          *(VmValue ***)(value + uVar11 * 8) = ppVVar8;
        }
        else if (VVar1 == VM_TYPE_INT) {
          if ((pTVar4->super_TypeBase).size != (ulong)(pVVar10->super_VmValue).type.size) {
            __assert_fail("elementType->size == element->type.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0xc83,
                          "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                         );
          }
          *(VmInstructionType *)(value + uVar11 * 4) = pVVar10->cmd;
        }
        else {
LAB_001b0f30:
          if ((VVar1 == VM_TYPE_DOUBLE) && (pTVar4 == (TypeArray *)ctx->typeFloat)) {
            *(float *)(value + uVar11 * 4) = (float)(double)(pVVar10->arguments).data;
          }
          else {
            if (VVar1 != VM_TYPE_STRUCT) {
              if (VVar1 != VM_TYPE_LONG) {
LAB_001b104c:
                __assert_fail("!\"unknown type\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0xc9b,
                              "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                             );
              }
              if ((pTVar4->super_TypeBase).size != (ulong)(pVVar10->super_VmValue).type.size) {
                __assert_fail("elementType->size == element->type.size",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0xc91,
                              "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                             );
              }
              ppVVar8 = *(VmValue ***)&(pVVar10->arguments).count;
              goto LAB_001b0fab;
            }
            __src = (pVVar10->arguments).little[0];
            if (__src == (VmValue *)0x0) goto LAB_001b104c;
            uVar2 = (pVVar10->super_VmValue).type.size;
            if ((pTVar4->super_TypeBase).size != (ulong)uVar2) {
              __assert_fail("elementType->size == element->type.size",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0xc96,
                            "VmConstant *GetConstantArrayValue(ExpressionContext &, SynBase *, TypeArray *, VmInstruction *)"
                           );
            }
            memcpy(value + (int)uVar11 * uVar2,__src,(ulong)uVar2);
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (instInit->arguments).count);
  }
  pVVar9 = CreateConstantStruct(ctx->allocator,source,value,(int)uVar3,&typeArray->super_TypeBase);
  return pVVar9;
}

Assistant:

VmConstant* GetConstantArrayValue(ExpressionContext &ctx, SynBase *source, TypeArray *typeArray, VmInstruction *instInit)
{
	assert(typeArray);

	TypeBase *elementType = typeArray->subType;

	unsigned size = unsigned(typeArray->size);

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < instInit->arguments.size(); i++)
	{
		VmValue *elementValue = instInit->arguments[i];

		if(VmInstruction *elementInst = getType<VmInstruction>(elementValue))
		{
			if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
			{
				elementValue = elementInst->arguments[0];
			}
			else if(elementInst->cmd == VM_INST_ARRAY)
			{
				VmConstant *elemConst = GetConstantArrayValue(ctx, NULL, getType<TypeArray>(elementType), elementInst);

				assert(elementType->size == elemConst->type.size);
				memcpy(value + i * elementType->size, elemConst->sValue, unsigned(elementType->size));
				continue;
			}
		}

		VmConstant *element = getType<VmConstant>(elementValue);

		if(element->type.type == VM_TYPE_INT)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(int), &element->iValue, sizeof(int));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeDouble)
		{
			memcpy(value + i * sizeof(double), &element->dValue, sizeof(double));
		}
		else if(element->type.type == VM_TYPE_DOUBLE && elementType == ctx.typeFloat)
		{
			float fValue = float(element->dValue);
			memcpy(value + i * sizeof(float), &fValue, sizeof(float));
		}
		else if(element->type.type == VM_TYPE_LONG)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * sizeof(long long), &element->lValue, sizeof(long long));
		}
		else if(element->type.type == VM_TYPE_STRUCT && element->sValue)
		{
			assert(elementType->size == element->type.size);
			memcpy(value + i * element->type.size, element->sValue, element->type.size);
		}
		else
		{
			assert(!"unknown type");
		}
	}

	return CreateConstantStruct(ctx.allocator, source, value, size, typeArray);
}